

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::interval_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  CURSOR *pCVar4;
  ColumnDataScanState *pCVar5;
  long lVar6;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp_01;
  bool bVar7;
  ulong uVar8;
  reference pvVar9;
  InvalidInputException *pIVar10;
  int64_t iVar11;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *pMVar12;
  RESULT_TYPE RVar13;
  interval_t iVar14;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_88;
  pointer local_68;
  size_type sStack_60;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *local_50;
  pointer local_48;
  size_type sStack_40;
  
  bVar7 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_88._M_dataplus._M_p = (pointer)accessor;
  local_88._M_string_length = (size_type)accessor;
  local_88.field_2._M_local_buf[0] = bVar7;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar7;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    pMVar12 = accessor->outer;
    pCVar4 = accessor->inner->data;
    pCVar5 = (ColumnDataScanState *)v_t[this->FRN];
    if (((ColumnDataScanState *)(pCVar4->scan).next_row_index <= pCVar5) ||
       (pCVar5 < (ColumnDataScanState *)(pCVar4->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek((ulong)pCVar4->inputs,pCVar5,(DataChunk *)&pCVar4->scan);
      pvVar9 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
      pCVar4->data = *(timestamp_t **)(pvVar9 + 0x20);
      pvVar9 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar4->validity = (ValidityMask *)(pvVar9 + 0x28);
    }
    local_88._M_dataplus._M_p =
         (pointer)pCVar4->data[(uint)((int)pCVar5 - (int)(pCVar4->scan).current_row_index)].value;
    RVar13 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar12,(INPUT_TYPE *)&local_88);
    input._0_8_ = RVar13.micros;
    iVar11 = 0;
    bVar7 = duckdb::TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar13,(interval_t *)&local_68,false);
    if (!bVar7) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar13._0_8_,input);
      duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar14.micros = sStack_60;
    iVar14._0_8_ = local_68;
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar7;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_88._M_dataplus._M_p = (pointer)accessor;
    local_88._M_string_length = (size_type)accessor;
    local_88.field_2._M_local_buf[0] = bVar7;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar8 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar7;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    pCVar4 = accessor->inner->data;
    pCVar5 = (ColumnDataScanState *)v_t[this->FRN];
    if (((ColumnDataScanState *)(pCVar4->scan).next_row_index <= pCVar5) ||
       (pMVar12 = accessor->outer, pCVar5 < (ColumnDataScanState *)(pCVar4->scan).current_row_index)
       ) {
      local_50 = accessor->outer;
      duckdb::ColumnDataCollection::Seek((ulong)pCVar4->inputs,pCVar5,(DataChunk *)&pCVar4->scan);
      pvVar9 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
      pCVar4->data = *(timestamp_t **)(pvVar9 + 0x20);
      pvVar9 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar4->validity = (ValidityMask *)(pvVar9 + 0x28);
      pMVar12 = local_50;
    }
    local_88._M_dataplus._M_p =
         (pointer)pCVar4->data[(uint)((int)pCVar5 - (int)(pCVar4->scan).current_row_index)].value;
    RVar13 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar12,(INPUT_TYPE *)&local_88);
    input_00._0_8_ = RVar13.micros;
    iVar11 = 0;
    bVar7 = duckdb::TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar13,(interval_t *)&local_68,false);
    if (!bVar7) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar13._0_8_,input_00);
      duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48 = local_68;
    sStack_40 = sStack_60;
    pMVar12 = accessor->outer;
    pCVar4 = accessor->inner->data;
    pCVar5 = (ColumnDataScanState *)v_t[this->CRN];
    if (((ColumnDataScanState *)(pCVar4->scan).next_row_index <= pCVar5) ||
       (pCVar5 < (ColumnDataScanState *)(pCVar4->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek((ulong)pCVar4->inputs,pCVar5,(DataChunk *)&pCVar4->scan);
      pvVar9 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
      pCVar4->data = *(timestamp_t **)(pvVar9 + 0x20);
      pvVar9 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar4->validity = (ValidityMask *)(pvVar9 + 0x28);
    }
    local_88._M_dataplus._M_p =
         (pointer)pCVar4->data[(uint)((int)pCVar5 - (int)(pCVar4->scan).current_row_index)].value;
    RVar13 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar12,(INPUT_TYPE *)&local_88);
    input_01._0_8_ = RVar13.micros;
    iVar11 = 0;
    bVar7 = duckdb::TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar13,(interval_t *)&local_68,false);
    if (!bVar7) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar13._0_8_,input_01);
      duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_88._M_dataplus._M_p = local_68;
    local_88._M_string_length = sStack_60;
    iVar14 = CastInterpolation::Interpolate<duckdb::interval_t>
                       ((interval_t *)&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_88);
  }
  return iVar14;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}